

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::resetAll
          (SeparatedSyntaxList<slang::syntax::SyntaxNode> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_type extraout_RDX;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_70;
  
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector(&local_70,children.size_);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::append<slang::syntax::TokenOrSyntax_const*,void>
            (&local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,children.data_,
             children.data_ + children.size_);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)alloc,src);
  (this->elements).data_ = (pointer)CONCAT44(extraout_var,iVar1);
  (this->elements).size_ = extraout_RDX;
  (this->super_SyntaxListBase).childCount =
       local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len;
  if (local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ !=
      (pointer)local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement) {
    free(local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_);
  }
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }